

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetNoInactiveRootWarn(void *arkode_mem)

{
  if (arkode_mem == (void *)0x0) {
    arkode_mem = (ARKodeMem)0x0;
  }
  else if (*(long *)((long)arkode_mem + 0x280) != 0) {
    *(undefined4 *)(*(long *)((long)arkode_mem + 0x280) + 0x78) = 0;
    return 0;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,"ARKode","arkSetNoInactiveRootWarn",
                  "arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int arkSetNoInactiveRootWarn(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetNoInactiveRootWarn", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkSetNoInactiveRootWarn", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
  ark_root_mem->mxgnull = 0;
  return(ARK_SUCCESS);
}